

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_legacy_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  if ((pSVar1->basetype | Boolean) != Sampler) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_38,this,var);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_38,(char (*) [2])0x313c50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Separate image and samplers not supported in legacy HLSL.");
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerHLSL::emit_legacy_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::Sampler:
	case SPIRType::Image:
		SPIRV_CROSS_THROW("Separate image and samplers not supported in legacy HLSL.");

	default:
		statement(variable_decl(var), ";");
		break;
	}
}